

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::read_byte_string(basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
                   *this,byte_string_type *v,error_code *ec)

{
  size_t *psVar1;
  byte bVar2;
  pointer puVar3;
  byte *pbVar4;
  pointer pvVar5;
  uint64_t uVar6;
  type_conflict2 tVar7;
  assertion_error *this_00;
  ulong uVar8;
  ulong uVar9;
  cbor_errc __e;
  int local_78;
  allocator_type local_71;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  puVar3 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  pbVar4 = (this->source_).current_.p_;
  if (pbVar4 == (this->source_).end_.p_) {
LAB_002d97e3:
    std::error_code::operator=(ec,unexpected_eof);
    return;
  }
  bVar2 = *pbVar4;
  if ((bVar2 & 0xe0) != 0x40) {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,
               "assertion \'major_type == jsoncons::cbor::detail::cbor_major_type::byte_string\' failed at  <> :0"
               ,"");
    assertion_error::assertion_error(this_00,(string *)local_70);
    __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((~bVar2 & 0x1f) == 0) {
    local_78 = 0;
LAB_002d963f:
    do {
      pbVar4 = (this->source_).current_.p_;
      if (pbVar4 == (this->source_).end_.p_) {
        __e = unexpected_eof;
LAB_002d980a:
        std::error_code::operator=(ec,__e);
        this->more_ = false;
        return;
      }
      bVar2 = *pbVar4;
      if (bVar2 == 0xff && 0 < local_78) {
        psVar1 = &(this->source_).position_;
        *psVar1 = *psVar1 + 1;
        (this->source_).current_.p_ = pbVar4 + 1;
        local_78 = local_78 + -1;
        if (local_78 == 0) {
          return;
        }
        goto LAB_002d963f;
      }
      if ((bVar2 & 0xe0) != 0x40) {
        __e = illegal_chunked_string;
        goto LAB_002d980a;
      }
      if ((~bVar2 & 0x1f) == 0) {
        psVar1 = &(this->source_).position_;
        *psVar1 = *psVar1 + 1;
        local_78 = local_78 + 1;
        (this->source_).current_.p_ = pbVar4 + 1;
      }
      else {
        uVar6 = get_uint64_value(this,ec);
        if (ec->_M_value != 0) {
          return;
        }
        tVar7 = source_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>>::
                read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          (&this->source_,v,uVar6);
        if (tVar7 != uVar6) {
          std::error_code::operator=(ec,unexpected_eof);
        }
        this->more_ = tVar7 == uVar6;
        if (ec->_M_value != 0 || local_78 == 0) {
          return;
        }
      }
    } while( true );
  }
  uVar6 = get_uint64_value(this,ec);
  if (ec->_M_value == 0) {
    tVar7 = source_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>>::
            read<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&this->source_,v,uVar6);
    if (tVar7 != uVar6) goto LAB_002d97e3;
    pvVar5 = (this->stringref_map_stack_).
             super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->stringref_map_stack_).
        super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pvVar5) {
      uVar8 = (long)pvVar5[-1].
                    super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)pvVar5[-1].
                    super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
      uVar9 = 3;
      if (((0x17 < uVar8) && (uVar9 = 4, 0xff < uVar8)) && (uVar9 = 5, 0xffff < uVar8)) {
        uVar9 = (ulong)(uVar8 >> 0x20 != 0) * 4 + 7;
      }
      if (uVar9 <= (ulong)((long)(v->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(v->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start)) {
        local_70._8_8_ = &local_58;
        local_70[0] = byte_string;
        local_70._16_8_ = 0;
        local_58._M_local_buf[0] = '\0';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_48,v,&local_71);
        std::
        vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>::mapped_string,std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>::mapped_string>>
        ::
        emplace_back<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>::mapped_string>
                  ((vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>::mapped_string,std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>::mapped_string>>
                    *)(pvVar5 + -1),(mapped_string *)local_70);
        mapped_string::~mapped_string((mapped_string *)local_70);
      }
    }
  }
  return;
}

Assistant:

void read_byte_string(byte_string_type& v, std::error_code& ec)
    {
        v.clear();
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);
        uint8_t info = get_additional_information_value(c.value);

        JSONCONS_ASSERT(major_type == jsoncons::cbor::detail::cbor_major_type::byte_string);

        switch(info)
        {
            case jsoncons::cbor::detail::additional_info::indefinite_length:
            {
                auto func = [&v](Source& source, std::size_t length, std::error_code& ec) -> bool
                {
                    if (source_reader<Source>::read(source, v, length) != length)
                    {
                        ec = cbor_errc::unexpected_eof;
                        return false;
                    }
                    return true;
                };
                iterate_string_chunks(func, major_type, ec);
                break;
            }
            default:
            {
                std::size_t length = get_size(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (source_reader<Source>::read(source_, v, length) != length)
                {
                    ec = cbor_errc::unexpected_eof;
                    return;
                }
                if (!stringref_map_stack_.empty() &&
                    v.size() >= jsoncons::cbor::detail::min_length_for_stringref(stringref_map_stack_.back().size()))
                {
                    stringref_map_stack_.back().emplace_back(mapped_string(v, alloc_));
                }
                break;
            }

        }
    }